

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

int stat_make_tree(nni_stat_item *item,nni_stat **sp)

{
  int iVar1;
  nni_stat *pnStack_38;
  int rv;
  nni_stat *cs;
  nni_stat_item *child;
  nni_stat *stat;
  nni_stat **sp_local;
  nni_stat_item *item_local;
  
  stat = (nni_stat *)sp;
  sp_local = (nni_stat **)item;
  child = (nni_stat_item *)nni_zalloc(0x50);
  if (child == (nni_stat_item *)0x0) {
    item_local._4_4_ = 2;
  }
  else {
    nni_list_init_offset(&child->si_children,0x30);
    (child->si_node).ln_next = (nni_list_node *)sp_local[5];
    (child->si_node).ln_prev = (nni_list_node *)sp_local;
    child->si_info = (nni_stat_info *)0x0;
    for (cs = (nni_stat *)nni_list_first((nni_list *)(sp_local + 2)); cs != (nni_stat *)0x0;
        cs = (nni_stat *)nni_list_next((nni_list *)(sp_local + 2),cs)) {
      iVar1 = stat_make_tree((nni_stat_item *)cs,&stack0xffffffffffffffc8);
      if (iVar1 != 0) {
        nng_stats_free((nni_stat *)child);
        return iVar1;
      }
      nni_list_append(&child->si_children,pnStack_38);
      pnStack_38->s_parent = (nni_stat *)child;
    }
    stat->s_info = (nni_stat_info *)child;
    item_local._4_4_ = 0;
  }
  return item_local._4_4_;
}

Assistant:

static int
stat_make_tree(nni_stat_item *item, nni_stat **sp)
{
	nni_stat      *stat;
	nni_stat_item *child;

	if ((stat = NNI_ALLOC_STRUCT(stat)) == NULL) {
		return (NNG_ENOMEM);
	}
	NNI_LIST_INIT(&stat->s_children, nni_stat, s_node);

	stat->s_info   = item->si_info;
	stat->s_item   = item;
	stat->s_parent = NULL;

	NNI_LIST_FOREACH (&item->si_children, child) {
		nni_stat *cs;
		int       rv;
		if ((rv = stat_make_tree(child, &cs)) != 0) {
			nng_stats_free(stat);
			return (rv);
		}
		nni_list_append(&stat->s_children, cs);
		cs->s_parent = stat;
	}
	*sp = stat;
	return (0);
}